

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandQueueVkImpl.hpp
# Opt level: O3

void __thiscall
Diligent::CommandQueueVkImpl::SetFence
          (CommandQueueVkImpl *this,RefCntAutoPtr<Diligent::FenceVkImpl> *pFence)

{
  char (*in_RCX) [51];
  FenceVkImpl *pObj;
  FenceVkImpl *pFVar1;
  string msg;
  string local_38;
  
  pFVar1 = pFence->m_pObject;
  if ((pFVar1->super_FenceBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>.
      m_Desc.Type != FENCE_TYPE_CPU_WAIT_ONLY) {
    FormatString<char[26],char[51]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pFence->GetDesc().Type == FENCE_TYPE_CPU_WAIT_ONLY",in_RCX);
    in_RCX = (char (*) [51])0x93;
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"SetFence",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/CommandQueueVkImpl.hpp"
               ,0x93);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    pFVar1 = pFence->m_pObject;
  }
  if ((pFVar1->m_TimelineSemaphore).m_VkObject != (VkSemaphore_T *)0x0) {
    FormatString<char[26],char[31]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"!pFence->IsTimelineSemaphore()",(char (*) [31])in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"SetFence",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/CommandQueueVkImpl.hpp"
               ,0x94);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    pFVar1 = pFence->m_pObject;
  }
  if ((this->m_pFence).m_pObject != pFVar1) {
    pFence->m_pObject = (FenceVkImpl *)0x0;
    RefCntAutoPtr<Diligent::FenceVkImpl>::Release(&this->m_pFence);
    (this->m_pFence).m_pObject = pFVar1;
  }
  return;
}

Assistant:

void SetFence(RefCntAutoPtr<FenceVkImpl> pFence)
    {
        VERIFY_EXPR(pFence->GetDesc().Type == FENCE_TYPE_CPU_WAIT_ONLY);
        VERIFY_EXPR(!pFence->IsTimelineSemaphore());
        m_pFence = std::move(pFence);
    }